

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O2

void __thiscall features::deep_copy_from(features *this,features *src)

{
  copy_array<float>(&this->values,&src->values);
  copy_array<unsigned_long>(&this->indicies,&src->indicies);
  copy_array_no_memcpy<std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            (&this->space_names,&src->space_names);
  this->sum_feat_sq = src->sum_feat_sq;
  return;
}

Assistant:

void deep_copy_from(const features& src)
  {
    copy_array(values, src.values);
    copy_array(indicies, src.indicies);
    copy_array_no_memcpy(space_names, src.space_names);
    sum_feat_sq = src.sum_feat_sq;
  }